

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O0

LogEntry * __thiscall BuildLog::LookupByOutput(BuildLog *this,string *path)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true> local_40;
  StringPiece local_38;
  _Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true> local_28;
  iterator i;
  string *path_local;
  BuildLog *this_local;
  
  i.super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>)
       (_Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>)path;
  StringPiece::StringPiece(&local_38,path);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
       ::find(&this->entries_,&local_38);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
       ::end(&this->entries_);
  bVar1 = std::__detail::operator!=(&local_28,&local_40);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                         *)&local_28);
    this_local = (BuildLog *)ppVar2->second;
  }
  else {
    this_local = (BuildLog *)0x0;
  }
  return (LogEntry *)this_local;
}

Assistant:

BuildLog::LogEntry* BuildLog::LookupByOutput(const string& path) {
  Entries::iterator i = entries_.find(path);
  if (i != entries_.end())
    return i->second;
  return NULL;
}